

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O2

int __thiscall TPZCompElPostProc<TPZCompElDisc>::ClassId(TPZCompElPostProc<TPZCompElDisc> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZCompElPostProc",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZCompElDisc::ClassId(&this->super_TPZCompElDisc);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZCompElPostProc<TCOMPEL>::ClassId() const{
    return Hash("TPZCompElPostProc") ^ TCOMPEL::ClassId() << 1;
}